

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall
wabt::TypeChecker::OnRefFuncExpr(TypeChecker *this,Index func_type,bool force_generic_funcref)

{
  Type TVar1;
  undefined3 in_register_00000011;
  Type type;
  
  TVar1.enum_ = FuncRef;
  TVar1.type_index_ = 0;
  type = (Type)((ulong)func_type << 0x20 | 0xffffffeb);
  if (CONCAT31(in_register_00000011,force_generic_funcref) != 0) {
    type = TVar1;
  }
  if ((this->features_).function_references_enabled_ == false) {
    type = TVar1;
  }
  PushType(this,type);
  return (Result)Ok;
}

Assistant:

Result TypeChecker::OnRefFuncExpr(Index func_type, bool force_generic_funcref) {
  /*
   * In a const expression, treat ref.func as producing a generic funcref.
   * This avoids having to implement funcref subtyping (for now) and matches
   * the previous behavior where SharedValidator::OnElemSegmentElemExpr_RefFunc
   * examined only the validity of the function index.
   */
  if (features_.function_references_enabled() && !force_generic_funcref) {
    PushType(Type(Type::Reference, func_type));
  } else {
    PushType(Type::FuncRef);
  }
  return Result::Ok;
}